

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmMakefile *makefile)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmMakefile *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  long *plVar9;
  mapped_type *pmVar10;
  long lVar11;
  cmState *pcVar12;
  long *plVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Base_ptr p_Var16;
  long lVar17;
  pointer __rhs;
  string *cp;
  string *psVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpath;
  string replaceVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  undefined1 local_190 [40];
  undefined1 local_168 [40];
  key_type local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  _Base_ptr local_100;
  undefined1 local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  _Head_base<0UL,_cmCacheManager_*,_false> local_b0;
  _Head_base<0UL,_cmGlobVerificationManager_*,_false> local_a8;
  undefined1 local_a0 [32];
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmMakefile::GetStateSnapshot(makefile);
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,(cmStateSnapshot *)local_1a0);
  this->_vptr_cmLocalGenerator = (_func_int **)&PTR__cmLocalGenerator_0063a970;
  cmMakefile::GetStateSnapshot(makefile);
  cmMakefile::GetBacktrace(makefile);
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->EnvCPATH;
  p_Var1 = &(this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header;
  (this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->EnvCPATH)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_buckets =
       &(this->GeneratorTargetSearchIndex)._M_h._M_single_bucket;
  (this->GeneratorTargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->GeneratorTargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_element_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_buckets =
       &(this->ImportedGeneratorTargets)._M_h._M_single_bucket;
  (this->ImportedGeneratorTargets)._M_h._M_bucket_count = 1;
  (this->ImportedGeneratorTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_element_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedGeneratorTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &this->Compilers;
  p_Var2 = &(this->Compilers)._M_t._M_impl.super__Rb_tree_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190._32_8_ = &this->VariableMappings;
  p_Var2 = &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_head_impl = (cmGlobVerificationManager *)&this->CompilerSysroot;
  local_100 = (_Base_ptr)&(this->CompilerSysroot).field_2;
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)local_100;
  (this->CompilerSysroot)._M_string_length = 0;
  (this->CompilerSysroot).field_2._M_local_buf[0] = '\0';
  local_b0._M_head_impl = (cmCacheManager *)&this->LinkerSysroot;
  local_b8 = &(this->LinkerSysroot).field_2;
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)local_b8;
  (this->LinkerSysroot)._M_string_length = 0;
  (this->LinkerSysroot).field_2._M_local_buf[0] = '\0';
  this->GlobalGenerator = gg;
  this->Makefile = makefile;
  local_50 = &this->AliasTargets;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1a0,&(makefile->AliasTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->AliasTargets)._M_t);
  if ((_Base_ptr)local_190._0_8_ != (_Base_ptr)0x0) {
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_198._0_4_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_190._0_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_190._8_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_190._16_8_;
    *(_Rb_tree_header **)(local_190._0_8_ + 8) = p_Var1;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_190._24_8_;
    local_190._0_8_ = (_Base_ptr)0x0;
    local_190._24_8_ = (_Base_ptr)0x0;
    local_190._8_8_ = (_Base_ptr)local_198;
    local_190._16_8_ = (_Base_ptr)local_198;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1a0);
  this_00 = local_80;
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  ComputeObjectMaxPath(this);
  local_168._0_8_ = (string *)0x0;
  local_168._8_8_ = (string *)0x0;
  local_168._16_8_ = (pointer)0x0;
  cmsys::SystemTools::GetPath
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168,"CPATH");
  uVar5 = local_168._8_8_;
  if (local_168._0_8_ != local_168._8_8_) {
    psVar18 = (string *)local_168._0_8_;
    do {
      bVar6 = cmsys::SystemTools::FileIsFullPath(psVar18);
      if (bVar6) {
        cmsys::SystemTools::CollapseFullPath((string *)local_1a0,psVar18);
        std::__cxx11::string::operator=((string *)psVar18,(string *)local_1a0);
        if (local_1a0 != (undefined1  [8])local_190) {
          operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string>(this_00,psVar18);
      }
      psVar18 = psVar18 + 1;
    } while (psVar18 != (string *)uVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_48,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar3 = this->Makefile;
  local_1a0 = (undefined1  [8])local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT_COMPILE","");
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1a0);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
  }
  if (pcVar8 == (char *)0x0) {
    pcVar3 = this->Makefile;
    local_1a0 = (undefined1  [8])local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1a0);
    std::__cxx11::string::_M_assign((string *)local_a8._M_head_impl);
    if (local_1a0 != (undefined1  [8])local_190) {
      operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
    }
  }
  else {
    pcVar4 = (char *)(this->CompilerSysroot)._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)local_a8._M_head_impl,0,pcVar4,(ulong)pcVar8);
  }
  pcVar3 = this->Makefile;
  local_1a0 = (undefined1  [8])local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT_LINK","");
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_1a0);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
  }
  if (pcVar8 == (char *)0x0) {
    pcVar3 = this->Makefile;
    local_1a0 = (undefined1  [8])local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1a0);
    std::__cxx11::string::_M_assign((string *)local_b0._M_head_impl);
    if (local_1a0 != (undefined1  [8])local_190) {
      operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
    }
  }
  else {
    pcVar4 = (char *)(this->LinkerSysroot)._M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)local_b0._M_head_impl,0,pcVar4,(ulong)pcVar8);
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __rhs = (pointer)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar7 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar7 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_168);
        local_1a0 = (undefined1  [8])local_190;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_190._8_8_ = plVar9[3];
        }
        else {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_1a0 = (undefined1  [8])*plVar9;
        }
        local_198 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_78,(key_type *)local_1a0);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if (local_1a0 != (undefined1  [8])local_190) {
          operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
        }
        if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        pcVar3 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_168);
        local_1a0 = (undefined1  [8])local_190;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_190._8_8_ = plVar9[3];
        }
        else {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_1a0 = (undefined1  [8])*plVar9;
        }
        local_198 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cmMakefile::GetSafeDefinition(pcVar3,(string *)local_1a0);
        std::operator+(&local_120,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        plVar13 = plVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar13) {
          local_140.field_2._M_allocated_capacity = *plVar13;
          local_140.field_2._8_8_ = plVar9[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *plVar13;
          local_140._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_140._M_string_length = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,&local_140);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          (ulong)(local_140.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0 != (undefined1  [8])local_190) {
          operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
        }
        if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_168);
        local_1a0 = (undefined1  [8])local_190;
        pcVar12 = (cmState *)(plVar9 + 2);
        if ((cmState *)*plVar9 == pcVar12) {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_190._8_8_ = plVar9[3];
        }
        else {
          local_190._0_8_ = *(undefined8 *)&(pcVar12->PropertyDefinitions)._M_t._M_impl;
          local_1a0 = (undefined1  [8])*plVar9;
        }
        local_198 = (undefined1  [8])plVar9[1];
        *plVar9 = (long)pcVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        std::operator+(&local_140,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_168._0_8_ = local_168 + 0x10;
        psVar18 = (string *)(plVar9 + 2);
        if ((string *)*plVar9 == psVar18) {
          local_168._16_8_ = (psVar18->_M_dataplus)._M_p;
          local_168._24_8_ = plVar9[3];
        }
        else {
          local_168._16_8_ = (psVar18->_M_dataplus)._M_p;
          local_168._0_8_ = (string *)*plVar9;
        }
        local_168._8_8_ = plVar9[1];
        *plVar9 = (long)psVar18;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          (ulong)(local_140.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_120,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        plVar13 = plVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar13) {
          local_140.field_2._M_allocated_capacity = *plVar13;
          local_140.field_2._8_8_ = plVar9[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *plVar13;
          local_140._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_140._M_string_length = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_d8,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        psVar14 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_120.field_2._M_allocated_capacity = *psVar14;
          local_120.field_2._8_8_ = plVar9[3];
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar14;
          local_120._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_120._M_string_length = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_f8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar15) {
          local_d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_d8.field_2._8_8_ = plVar9[3];
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_d8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_d8._M_string_length = plVar9[1];
        *plVar9 = (long)paVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_f8._0_8_ = local_f8 + 0x10;
        p_Var16 = (_Base_ptr)(plVar9 + 2);
        if ((_Base_ptr)*plVar9 == p_Var16) {
          local_f8._16_8_ = *(undefined8 *)p_Var16;
          local_f8._24_8_ = plVar9[3];
        }
        else {
          local_f8._16_8_ = *(undefined8 *)p_Var16;
          local_f8._0_8_ = (_Base_ptr)*plVar9;
        }
        local_f8._8_8_ = plVar9[1];
        *plVar9 = (long)p_Var16;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1a0);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,(key_type *)local_1a0);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_168);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,(key_type *)local_168);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_140);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,&local_140);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_120);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,&local_120);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_d8);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,&local_d8);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_f8);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_190._32_8_,(key_type *)local_f8);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        lVar17 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,*(char **)((long)&_ZGRL15ruleReplaceVars_ + lVar17),
                     (allocator<char> *)local_70._M_local_buf);
          lVar11 = std::__cxx11::string::find((char *)local_a0,0x508e86,0);
          if (lVar11 != -1) {
            local_70._M_allocated_capacity = (size_type)&local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"${LANG}","");
            cmsys::SystemTools::ReplaceString
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,(string *)&local_70,(string *)__rhs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_allocated_capacity != &local_60) {
              operator_delete((void *)local_70._M_allocated_capacity,
                              (ulong)(local_60._M_allocated_capacity + 1));
            }
          }
          cmMakefile::GetSafeDefinition
                    (this->Makefile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_190._32_8_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0);
          std::__cxx11::string::_M_assign((string *)pmVar10);
          if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
          }
          lVar17 = lVar17 + 8;
        } while (lVar17 != 0x88);
        if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          (ulong)(local_140.field_2._M_allocated_capacity + 1));
        }
        if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if (local_1a0 != (undefined1  [8])local_190) {
          operator_delete((void *)local_1a0,(ulong)(local_190._0_8_ + 1));
        }
      }
      __rhs = (pointer)((__rhs->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w + 4);
    } while (__rhs != (pointer)local_48.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg, cmMakefile* makefile)
  : cmOutputConverter(makefile->GetStateSnapshot())
  , StateSnapshot(makefile->GetStateSnapshot())
  , DirectoryBacktrace(makefile->GetBacktrace())
{
  this->GlobalGenerator = gg;

  this->Makefile = makefile;

  this->AliasTargets = makefile->GetAliasTargets();

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;

  this->ComputeObjectMaxPath();

  // Canonicalize entries of the CPATH environment variable the same
  // way detection of CMAKE_<LANG>_IMPLICIT_INCLUDE_DIRECTORIES does.
  {
    std::vector<std::string> cpath;
    cmSystemTools::GetPath(cpath, "CPATH");
    for (std::string& cp : cpath) {
      if (cmSystemTools::FileIsFullPath(cp)) {
        cp = cmSystemTools::CollapseFullPath(cp);
        this->EnvCPATH.emplace(std::move(cp));
      }
    }
  }

  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();

  if (const char* sysrootCompile =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE")) {
    this->CompilerSysroot = sysrootCompile;
  } else {
    this->CompilerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (const char* sysrootLink =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    this->LinkerSysroot = sysrootLink;
  } else {
    this->LinkerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  for (std::string const& lang : enabledLanguages) {
    if (lang == "NONE") {
      continue;
    }
    this->Compilers["CMAKE_" + lang + "_COMPILER"] = lang;

    this->VariableMappings["CMAKE_" + lang + "_COMPILER"] =
      this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER");

    std::string const& compilerArg1 = "CMAKE_" + lang + "_COMPILER_ARG1";
    std::string const& compilerTarget = "CMAKE_" + lang + "_COMPILER_TARGET";
    std::string const& compilerOptionTarget =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_TARGET";
    std::string const& compilerExternalToolchain =
      "CMAKE_" + lang + "_COMPILER_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionExternalToolchain =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionSysroot =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_SYSROOT";

    this->VariableMappings[compilerArg1] =
      this->Makefile->GetSafeDefinition(compilerArg1);
    this->VariableMappings[compilerTarget] =
      this->Makefile->GetSafeDefinition(compilerTarget);
    this->VariableMappings[compilerOptionTarget] =
      this->Makefile->GetSafeDefinition(compilerOptionTarget);
    this->VariableMappings[compilerExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerExternalToolchain);
    this->VariableMappings[compilerOptionExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerOptionExternalToolchain);
    this->VariableMappings[compilerOptionSysroot] =
      this->Makefile->GetSafeDefinition(compilerOptionSysroot);

    for (std::string replaceVar : ruleReplaceVars) {
      if (replaceVar.find("${LANG}") != std::string::npos) {
        cmSystemTools::ReplaceString(replaceVar, "${LANG}", lang);
      }

      this->VariableMappings[replaceVar] =
        this->Makefile->GetSafeDefinition(replaceVar);
    }
  }
}